

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

pointer __thiscall
QList<QStyleOptionViewItem::ViewItemPosition>::data
          (QList<QStyleOptionViewItem::ViewItemPosition> *this)

{
  QArrayDataPointer<QStyleOptionViewItem::ViewItemPosition> *this_00;
  ViewItemPosition *pVVar1;
  QArrayDataPointer<QStyleOptionViewItem::ViewItemPosition> *in_RDI;
  
  detach((QList<QStyleOptionViewItem::ViewItemPosition> *)0x90903c);
  this_00 = (QArrayDataPointer<QStyleOptionViewItem::ViewItemPosition> *)
            QArrayDataPointer<QStyleOptionViewItem::ViewItemPosition>::operator->(in_RDI);
  pVVar1 = QArrayDataPointer<QStyleOptionViewItem::ViewItemPosition>::data(this_00);
  return pVVar1;
}

Assistant:

pointer data() { detach(); return d->data(); }